

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2protocolhandler.cpp
# Opt level: O0

void __thiscall
QHttp2ProtocolHandler::QHttp2ProtocolHandler
          (QHttp2ProtocolHandler *this,QHttpNetworkConnectionChannel *channel)

{
  long lVar1;
  ConnectionType CVar2;
  QHttp2Connection *pQVar3;
  ContextType *in_RSI;
  Object *in_RDI;
  long in_FS_OFFSET;
  QHttp2Stream *stream;
  QHttp2Configuration h2Config;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  QAbstractProtocolHandler *in_stack_ffffffffffffff30;
  Connection *pCVar4;
  QHttpNetworkRequest *in_stack_ffffffffffffff38;
  QHttp2Connection *in_stack_ffffffffffffff40;
  QIODevice *in_stack_ffffffffffffff50;
  QIODevice *in_stack_ffffffffffffff58;
  undefined8 in_stack_ffffffffffffff68;
  quint32 streamID;
  code *slot;
  ContextType *context;
  Object *in_stack_ffffffffffffff80;
  Object *sender;
  Connection in_stack_ffffffffffffffa0;
  offset_in_QHttp2Connection_to_subr signal;
  Connection local_48;
  ConnectionType type;
  ConnectionType in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  QHttp2ProtocolHandler *in_stack_ffffffffffffffd8;
  
  streamID = (quint32)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  sender = in_RDI;
  QObject::QObject(&in_RDI->super_QObject,(QObject *)0x0);
  QAbstractProtocolHandler::QAbstractProtocolHandler
            (in_stack_ffffffffffffff30,
             (QHttpNetworkConnectionChannel *)
             CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  *(undefined ***)in_RDI = &PTR_metaObject_0049dab8;
  *(undefined ***)&in_RDI->m_connectionType = &PTR__QHttp2ProtocolHandler_0049db40;
  *(undefined1 *)
   &(in_RDI->decoder).lookupTable.chunks.
    super__Deque_base<std::unique_ptr<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>,_std::default_delete<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>_>_>,_std::allocator<std::unique_ptr<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>,_std::default_delete<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>_>_>_>_>
    ._M_impl.super__Deque_impl_data._M_map_size = 0;
  QHash<QObject_*,_QPointer<QHttp2Stream>_>::QHash
            ((QHash<QObject_*,_QPointer<QHttp2Stream>_> *)
             &(in_RDI->decoder).lookupTable.chunks.
              super__Deque_base<std::unique_ptr<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>,_std::default_delete<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>_>_>,_std::allocator<std::unique_ptr<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>,_std::default_delete<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>_>_>_>_>
              ._M_impl.super__Deque_impl_data._M_start);
  QHash<QHttp2Stream_*,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::QHash
            ((QHash<QHttp2Stream_*,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)
             ((long)&(in_RDI->decoder).lookupTable.chunks.
                     super__Deque_base<std::unique_ptr<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>,_std::default_delete<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>_>_>,_std::allocator<std::unique_ptr<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>,_std::default_delete<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>_>_>_>_>
                     ._M_impl.super__Deque_impl_data._M_start + 8));
  QHttpNetworkConnection::http2Parameters((QHttpNetworkConnection *)in_stack_ffffffffffffff38);
  if (((byte)in_RSI[0x18] & 1) == 0) {
    CVar2 = QHttpNetworkConnection::connectionType
                      ((QHttpNetworkConnection *)in_stack_ffffffffffffff30);
    if (CVar2 != ConnectionTypeHTTP2Direct) {
      pQVar3 = QHttp2Connection::createUpgradedConnection
                         (in_stack_ffffffffffffff50,(QHttp2Configuration *)in_RDI);
      (in_RDI->decoder).lookupTable.chunks.
      super__Deque_base<std::unique_ptr<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>,_std::default_delete<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>_>_>,_std::allocator<std::unique_ptr<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>,_std::default_delete<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>_>_>_>_>
      ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)pQVar3;
      in_stack_ffffffffffffff80 =
           (Object *)QHttp2Connection::getStream(in_stack_ffffffffffffff40,streamID);
      std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>::
      pair<QHttpNetworkRequest_&,_QHttpNetworkReply_*&,_true>
                ((pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *)in_stack_ffffffffffffff40,
                 in_stack_ffffffffffffff38,(QHttpNetworkReply **)in_stack_ffffffffffffff30);
      connectStream(in_stack_ffffffffffffffd8,
                    (HttpMessagePair *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0)
                    ,stream);
      std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>::~pair
                ((pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *)0x2d050a);
      goto LAB_002d052e;
    }
  }
  pQVar3 = QHttp2Connection::createDirectConnection
                     (in_stack_ffffffffffffff58,(QHttp2Configuration *)in_stack_ffffffffffffff50);
  (in_RDI->decoder).lookupTable.chunks.
  super__Deque_base<std::unique_ptr<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>,_std::default_delete<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>_>_>,_std::allocator<std::unique_ptr<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>,_std::default_delete<std::vector<HPack::HeaderField,_std::allocator<HPack::HeaderField>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)pQVar3;
LAB_002d052e:
  type = 0x2d0a70;
  slot = QHttp2Connection::receivedGOAWAY;
  context = (ContextType *)0x0;
  pCVar4 = (Connection *)&stack0xffffffffffffffd0;
  QObject::
  connect<void(QHttp2Connection::*)(Http2::Http2Error,unsigned_int),void(QHttp2ProtocolHandler::*)(Http2::Http2Error,unsigned_int)>
            (in_stack_ffffffffffffff80,
             (offset_in_QHttp2Connection_to_subr)in_stack_ffffffffffffffa0.d_ptr,(ContextType *)0x0,
             (offset_in_QHttp2ProtocolHandler_to_subr *)QHttp2Connection::receivedGOAWAY,0x2d0a70);
  QMetaObject::Connection::~Connection(pCVar4);
  signal = 0;
  pCVar4 = &local_48;
  QObject::
  connect<void(QHttp2Connection::*)(Http2::Http2Error,QString_const&),void(QHttp2ProtocolHandler::*)(Http2::Http2Error,QString_const&)>
            (in_stack_ffffffffffffff80,
             (offset_in_QHttp2Connection_to_subr)in_stack_ffffffffffffffa0.d_ptr,context,
             (offset_in_QHttp2ProtocolHandler_to_subr *)slot,type);
  QMetaObject::Connection::~Connection(pCVar4);
  pCVar4 = (Connection *)&stack0xffffffffffffffa0;
  QObject::
  connect<void(QHttp2Connection::*)(QHttp2Stream*),QHttp2ProtocolHandler::QHttp2ProtocolHandler(QHttpNetworkConnectionChannel*)::__0>
            (sender,signal,in_RSI,(anon_class_8_1_8991fb9c_for_o *)in_stack_ffffffffffffff80,
             in_stack_ffffffffffffffd0);
  QMetaObject::Connection::~Connection(pCVar4);
  QHttp2Configuration::~QHttp2Configuration((QHttp2Configuration *)0x2d066f);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QHttp2ProtocolHandler::QHttp2ProtocolHandler(QHttpNetworkConnectionChannel *channel)
    : QAbstractProtocolHandler(channel)
{
    const auto h2Config = m_connection->http2Parameters();

    if (!channel->ssl
        && m_connection->connectionType() != QHttpNetworkConnection::ConnectionTypeHTTP2Direct) {
        h2Connection = QHttp2Connection::createUpgradedConnection(channel->socket, h2Config);
        // Since we upgraded there is already one stream (the request was sent as http1)
        // and we need to handle it:
        QHttp2Stream *stream = h2Connection->getStream(1);
        Q_ASSERT(stream);
        Q_ASSERT(channel->reply);
        connectStream({ channel->request, channel->reply }, stream);
    } else {
        Q_ASSERT(QSocketAbstraction::socketState(channel->socket) == QAbstractSocket::ConnectedState);
        h2Connection = QHttp2Connection::createDirectConnection(channel->socket, h2Config);
    }
    connect(h2Connection, &QHttp2Connection::receivedGOAWAY, this,
            &QHttp2ProtocolHandler::handleGOAWAY);
    connect(h2Connection, &QHttp2Connection::errorOccurred, this,
            &QHttp2ProtocolHandler::connectionError);
    connect(h2Connection, &QHttp2Connection::newIncomingStream, this,
            [this](QHttp2Stream *stream){
                // Having our peer start streams doesn't make sense. We are
                // doing regular http request-response.
                stream->sendRST_STREAM(REFUSE_STREAM);
                if (!h2Connection->isGoingAway())
                    h2Connection->close(Http2::PROTOCOL_ERROR);
            });
}